

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexes.cpp
# Opt level: O0

Keylet * __thiscall
jbcoin::keylet::ticket_t::operator()
          (Keylet *__return_storage_ptr__,ticket_t *this,AccountID *id,uint32_t seq)

{
  uint256 local_3c;
  uint32_t local_1c;
  AccountID *pAStack_18;
  uint32_t seq_local;
  AccountID *id_local;
  ticket_t *this_local;
  
  local_1c = seq;
  pAStack_18 = id;
  id_local = (AccountID *)this;
  getTicketIndex(&local_3c,id,seq);
  Keylet::Keylet(__return_storage_ptr__,ltTICKET,&local_3c);
  return __return_storage_ptr__;
}

Assistant:

Keylet ticket_t::operator()(AccountID const& id,
    std::uint32_t seq) const
{
    return { ltTICKET,
        getTicketIndex(id, seq) };
}